

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_23::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *_escapeCode_local;
  PosixColourImpl *this_local;
  
  pIVar2 = getCurrentContext();
  iVar1 = (*pIVar2->_vptr_IContext[4])();
  poVar3 = (ostream *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))();
  poVar3 = std::operator<<(poVar3,'\x1b');
  poVar3 = std::operator<<(poVar3,_escapeCode);
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void setColour(const char *_escapeCode) {
                // The escape sequence must be flushed to console, otherwise if
                // stdin and stderr are intermixed, we'd get accidentally coloured output.
                getCurrentContext().getConfig()->stream()
                    << '\033' << _escapeCode << std::flush;
            }